

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::atomic_binding_offset_overlap
               (NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "Atomic counters may not have overlapping offsets in the same binding.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  iterateShaders(ctx,TESTCASE_LAYOUT_BINDING_OFFSET_OVERLAP);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void atomic_binding_offset_overlap (NegativeTestContext& ctx)
{
	ctx.beginSection("Atomic counters may not have overlapping offsets in the same binding.");
	iterateShaders(ctx, TESTCASE_LAYOUT_BINDING_OFFSET_OVERLAP);
	ctx.endSection();
}